

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

st_quicly_pn_space_t * alloc_pn_space(size_t sz,uint32_t packet_tolerance)

{
  st_quicly_pn_space_t *psVar1;
  
  psVar1 = (st_quicly_pn_space_t *)malloc(sz);
  if (psVar1 == (st_quicly_pn_space_t *)0x0) {
    psVar1 = (st_quicly_pn_space_t *)0x0;
  }
  else {
    (psVar1->ack_queue).ranges = &(psVar1->ack_queue)._initial;
    (psVar1->ack_queue).num_ranges = 0;
    (psVar1->ack_queue).capacity = 1;
    psVar1->largest_pn_received_at = 0x7fffffffffffffff;
    psVar1->next_expected_packet_number = 0;
    psVar1->unacked_count = 0;
    psVar1->packet_tolerance = packet_tolerance;
    psVar1->ignore_order = '\0';
    memset(psVar1 + 1,0,sz - 0x48);
  }
  return psVar1;
}

Assistant:

static struct st_quicly_pn_space_t *alloc_pn_space(size_t sz, uint32_t packet_tolerance)
{
    struct st_quicly_pn_space_t *space;

    if ((space = malloc(sz)) == NULL)
        return NULL;

    quicly_ranges_init(&space->ack_queue);
    space->largest_pn_received_at = INT64_MAX;
    space->next_expected_packet_number = 0;
    space->unacked_count = 0;
    space->packet_tolerance = packet_tolerance;
    space->ignore_order = 0;
    if (sz != sizeof(*space))
        memset((uint8_t *)space + sizeof(*space), 0, sz - sizeof(*space));

    return space;
}